

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::PathTypeHandlerBase::EnsureInlineSlotCapacityIsLocked
          (PathTypeHandlerBase *this,bool startFromRoot)

{
  PathTypeSuccessorInfo *pPVar1;
  DynamicTypeHandler *pDVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  DynamicType *pDVar8;
  undefined4 *puVar9;
  PathTypeHandlerBase *this_00;
  long lVar10;
  long lVar11;
  ulong uVar12;
  
  do {
    if (((startFromRoot & 1U) == 0) ||
       (pDVar8 = (this->predecessorType).ptr, pDVar8 == (DynamicType *)0x0)) {
      if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) != 0) {
        return;
      }
      DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
      pPVar1 = (this->successorInfo).ptr;
      if (pPVar1 == (PathTypeSuccessorInfo *)0x0) {
        return;
      }
      if (pPVar1->kind != PathTypeSuccessorKindSingle) {
        lVar11 = *(long *)(pPVar1 + 8);
        if (lVar11 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0xdf,"(this->propertySuccessors)","this->propertySuccessors")
          ;
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
          lVar11 = *(long *)(pPVar1 + 8);
        }
        uVar6 = *(uint *)(lVar11 + 0x24);
        if (uVar6 != 0) {
          uVar12 = 0;
          do {
            iVar5 = *(int *)(*(long *)(lVar11 + 8) + uVar12 * 4);
            if (iVar5 != -1) {
              do {
                lVar10 = (long)iVar5;
                iVar5 = *(int *)(*(long *)(lVar11 + 0x10) + 8 + lVar10 * 0x18);
                lVar10 = **(long **)(*(long *)(lVar11 + 0x10) + lVar10 * 0x18);
                if (lVar10 != 0) {
                  pDVar2 = *(DynamicTypeHandler **)(lVar10 + 0x28);
                  iVar7 = (*pDVar2->_vptr_DynamicTypeHandler[0x4e])(pDVar2);
                  if (iVar7 == 0) {
                    (*pDVar2->_vptr_DynamicTypeHandler[0x3f])(pDVar2);
                  }
                  else {
                    this_00 = FromTypeHandler(pDVar2);
                    EnsureInlineSlotCapacityIsLocked(this_00,false);
                  }
                }
              } while (iVar5 != -1);
              uVar6 = *(uint *)(lVar11 + 0x24);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < uVar6);
        }
        return;
      }
      if (*(long **)(pPVar1 + 0x10) == (long *)0x0) {
        return;
      }
      lVar11 = **(long **)(pPVar1 + 0x10);
      if (lVar11 == 0) {
        return;
      }
      pDVar2 = *(DynamicTypeHandler **)(lVar11 + 0x28);
      iVar5 = (*pDVar2->_vptr_DynamicTypeHandler[0x4e])(pDVar2);
      if (iVar5 == 0) {
        (*pDVar2->_vptr_DynamicTypeHandler[0x3f])(pDVar2);
        return;
      }
      this = FromTypeHandler(pDVar2);
    }
    else {
      do {
        this = FromTypeHandler((pDVar8->typeHandler).ptr);
        pDVar8 = (this->predecessorType).ptr;
      } while (pDVar8 != (DynamicType *)0x0);
    }
    startFromRoot = false;
  } while( true );
}

Assistant:

void PathTypeHandlerBase::EnsureInlineSlotCapacityIsLocked(bool startFromRoot)
    {
        if (startFromRoot)
        {
            GetRootPathTypeHandler()->EnsureInlineSlotCapacityIsLocked(false);
            return;
        }

        Assert(!startFromRoot);

        if (!GetIsInlineSlotCapacityLocked())
        {
            SetIsInlineSlotCapacityLocked();

            this->MapSuccessors([](const PathTypeSuccessorKey, RecyclerWeakReference<DynamicType> * typeWeakReference)
            {
                DynamicType * type = typeWeakReference->Get();
                if (!type)
                {
                    return;
                }

                DynamicTypeHandler* successorTypeHandler = type->GetTypeHandler();
                successorTypeHandler->IsPathTypeHandler() ?
                    PathTypeHandlerBase::FromTypeHandler(successorTypeHandler)->EnsureInlineSlotCapacityIsLocked(false) :
                    successorTypeHandler->EnsureInlineSlotCapacityIsLocked();
            });
        }
    }